

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_implicit_module
                 (lyd_node **tree,lys_module *module,uint32_t implicit_options,lyd_node **diff)

{
  ly_ctx *plVar1;
  anon_union_8_3_0df1e6ad_for_ly_set_2 *local_a8;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_70;
  ly_ctx *local_68;
  ly_ht *local_60;
  ly_ht *getnext_ht;
  ly_set node_when;
  lyd_node *d;
  lyd_node *root;
  LY_ERR rc;
  lyd_node **diff_local;
  uint32_t implicit_options_local;
  lys_module *module_local;
  lyd_node **tree_local;
  
  node_when.field_2.dnodes = (lyd_node **)0x0;
  memset(&getnext_ht,0,0x10);
  local_60 = (ly_ht *)0x0;
  if (tree == (lyd_node **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","tree",
           "lyd_new_implicit_module");
    tree_local._4_4_ = LY_EINVAL;
  }
  else if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","module",
           "lyd_new_implicit_module");
    tree_local._4_4_ = LY_EINVAL;
  }
  else {
    if (*tree != (lyd_node *)0x0) {
      if ((*tree)->schema == (lysc_node *)0x0) {
        plVar1 = (ly_ctx *)(*tree)[2].schema;
      }
      else {
        plVar1 = (*tree)->schema->module->ctx;
      }
      if (((plVar1 != (ly_ctx *)0x0) && (module != (lys_module *)0x0)) &&
         (module->ctx != (ly_ctx *)0x0)) {
        if (*tree == (lyd_node *)0x0) {
          local_70 = (ly_ctx *)0x0;
        }
        else {
          if ((*tree)->schema == (lysc_node *)0x0) {
            local_68 = (ly_ctx *)(*tree)[2].schema;
          }
          else {
            local_68 = (*tree)->schema->module->ctx;
          }
          local_70 = local_68;
        }
        if (module == (lys_module *)0x0) {
          local_80 = (ly_ctx *)0x0;
        }
        else {
          local_80 = module->ctx;
        }
        if (local_70 != local_80) {
          if (*tree == (lyd_node *)0x0) {
            local_90 = (ly_ctx *)0x0;
          }
          else {
            if ((*tree)->schema == (lysc_node *)0x0) {
              local_88 = (ly_ctx *)(*tree)[2].schema;
            }
            else {
              local_88 = (*tree)->schema->module->ctx;
            }
            local_90 = local_88;
          }
          ly_log(local_90,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    if (diff != (lyd_node **)0x0) {
      *diff = (lyd_node *)0x0;
    }
    root._4_4_ = lyd_val_getnext_ht_new(&local_60);
    if (((root._4_4_ == LY_SUCCESS) &&
        (root._4_4_ = lyd_new_implicit((lyd_node *)0x0,tree,(lysc_node *)0x0,module,
                                       (ly_set *)&getnext_ht,(ly_set *)0x0,(ly_set *)0x0,
                                       implicit_options,local_60,diff), root._4_4_ == LY_SUCCESS))
       && (root._4_4_ = lyd_validate_unres(tree,module,LYD_TYPE_DATA_YANG,(ly_set *)&getnext_ht,1,
                                           (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,0
                                           ,diff), root._4_4_ == LY_SUCCESS)) {
      for (d = *tree; d != (lyd_node *)0x0; d = d->next) {
        if (diff == (lyd_node **)0x0) {
          local_a8 = (anon_union_8_3_0df1e6ad_for_ly_set_2 *)0x0;
        }
        else {
          local_a8 = &node_when.field_2;
        }
        root._4_4_ = lyd_new_implicit_tree(d,implicit_options,(lyd_node **)&local_a8->dnodes);
        if (root._4_4_ != LY_SUCCESS) break;
        if (node_when.field_2.dnodes != (lyd_node **)0x0) {
          lyd_insert_sibling(*diff,(lyd_node *)node_when.field_2.dnodes,diff);
          node_when.field_2.dnodes = (lyd_node **)0x0;
        }
      }
    }
    ly_set_erase((ly_set *)&getnext_ht,(_func_void_void_ptr *)0x0);
    lyd_val_getnext_ht_free(local_60);
    if ((root._4_4_ != LY_SUCCESS) && (diff != (lyd_node **)0x0)) {
      lyd_free_all(*diff);
      *diff = (lyd_node *)0x0;
    }
    tree_local._4_4_ = root._4_4_;
  }
  return tree_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_implicit_module(struct lyd_node **tree, const struct lys_module *module, uint32_t implicit_options,
        struct lyd_node **diff)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyd_node *root, *d = NULL;
    struct ly_set node_when = {0};
    struct ly_ht *getnext_ht = NULL;

    LY_CHECK_ARG_RET(NULL, tree, module, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(*tree ? LYD_CTX(*tree) : NULL, module ? module->ctx : NULL, LY_EINVAL);
    if (diff) {
        *diff = NULL;
    }

    /* create the getnext hash table for this module */
    LY_CHECK_GOTO(rc = lyd_val_getnext_ht_new(&getnext_ht), cleanup);

    /* add all top-level defaults for this module */
    rc = lyd_new_implicit(NULL, tree, NULL, module, &node_when, NULL, NULL, implicit_options, getnext_ht, diff);
    LY_CHECK_GOTO(rc, cleanup);

    /* resolve when and remove any invalid defaults */
    LY_CHECK_GOTO(rc = lyd_validate_unres(tree, module, 0, &node_when, LYXP_IGNORE_WHEN, NULL, NULL, NULL, NULL,
            0, diff), cleanup);

    /* process top-level (and nested) nodes */
    LY_LIST_FOR(*tree, root) {
        LY_CHECK_GOTO(rc = lyd_new_implicit_tree(root, implicit_options, diff ? &d : NULL), cleanup);

        if (d) {
            /* merge into one diff */
            lyd_insert_sibling(*diff, d, diff);
            d = NULL;
        }
    }

cleanup:
    ly_set_erase(&node_when, NULL);
    lyd_val_getnext_ht_free(getnext_ht);
    if (rc && diff) {
        lyd_free_all(*diff);
        *diff = NULL;
    }
    return rc;
}